

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType *
add_type_coercion(Context_conflict *ctx,MOJOSHADER_astExpression **left,
                 MOJOSHADER_astDataType *_ldatatype,MOJOSHADER_astExpression **right,
                 MOJOSHADER_astDataType *_rdatatype)

{
  MOJOSHADER_astDataTypeType MVar1;
  bool bVar2;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_astDataType *pMVar4;
  MOJOSHADER_astExpression *pMVar5;
  undefined4 *puVar6;
  MOJOSHADER_astExpression *pMVar7;
  ulong uVar8;
  long lVar9;
  MOJOSHADER_astDataTypeType MVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  MOJOSHADER_astDataTypeType *pMVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  
  pMVar3 = reduce_datatype(ctx,_ldatatype);
  pMVar4 = reduce_datatype(ctx,_rdatatype);
  if (pMVar3 == pMVar4) {
    return pMVar3;
  }
  uVar8 = 6;
  if (pMVar3 == (MOJOSHADER_astDataType *)0x0) {
    bVar16 = true;
    bVar18 = true;
    uVar13 = 6;
  }
  else {
    MVar1 = pMVar3->type;
    bVar16 = MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR;
    MVar10 = MVar1;
    if (!bVar16 || MVar1 == MOJOSHADER_AST_DATATYPE_MATRIX) {
      MVar10 = ((pMVar3->array).base)->type;
    }
    bVar18 = bVar16 && MVar1 != MOJOSHADER_AST_DATATYPE_MATRIX ||
             MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR;
    pMVar14 = &DAT_0015dfc0;
    uVar13 = 0;
    do {
      if (*pMVar14 == MVar10) goto LAB_001442d2;
      uVar13 = uVar13 + 1;
      pMVar14 = pMVar14 + 4;
    } while (uVar13 != 6);
    uVar13 = 6;
LAB_001442d2:
    uVar13 = uVar13 & 0xffffffff;
  }
  if (pMVar4 == (MOJOSHADER_astDataType *)0x0) {
    bVar17 = false;
    bVar15 = false;
  }
  else {
    MVar1 = pMVar4->type;
    bVar17 = MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR;
    bVar15 = MVar1 - MOJOSHADER_AST_DATATYPE_VECTOR < 2;
    MVar10 = MVar1;
    if (bVar15) {
      MVar10 = ((pMVar4->array).base)->type;
    }
    bVar15 = bVar15 && MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR;
    pMVar14 = &DAT_0015dfc0;
    uVar8 = 0;
    do {
      if (*pMVar14 == MVar10) goto LAB_00144333;
      uVar8 = uVar8 + 1;
      pMVar14 = pMVar14 + 4;
    } while (uVar8 != 6);
    uVar8 = 6;
LAB_00144333:
    uVar8 = uVar8 & 0xffffffff;
  }
  bVar12 = false;
  bVar2 = true;
  if (5 < (uint)uVar13) {
    bVar19 = false;
    goto LAB_001443a7;
  }
  bVar19 = false;
  if (5 < (uint)uVar8) goto LAB_001443a7;
  bVar19 = false;
  bVar12 = true;
  bVar2 = false;
  if (left != (MOJOSHADER_astExpression **)0x0) {
    bVar2 = false;
    if (!bVar18 && !bVar15) goto LAB_001443a7;
    if (!(bool)(bVar18 & bVar15)) {
      if (!(bool)(bVar16 | bVar17)) {
LAB_0014439f:
        bVar12 = true;
        bVar2 = false;
        goto LAB_001443a4;
      }
      if (!(bool)(bVar16 & bVar17)) {
        lVar11 = uVar13 * 0x10;
        lVar9 = uVar8 * 0x10;
        if (*(int *)(&UNK_0015dfc4 + lVar9) < *(int *)(&UNK_0015dfc4 + lVar11)) goto LAB_0014439f;
        if (*(int *)(&UNK_0015dfc4 + lVar9) <= *(int *)(&UNK_0015dfc4 + lVar11)) {
          if (*(int *)(&UNK_0015dfcc + lVar11) == 0) {
LAB_0014454a:
            if (*(int *)(&UNK_0015dfcc + lVar9) != 0) goto LAB_00144369;
          }
          else {
            if (*(int *)(&UNK_0015dfcc + lVar9) == 0) goto LAB_0014439f;
            if (*(int *)(&UNK_0015dfcc + lVar11) == 0) goto LAB_0014454a;
          }
          bVar18 = *(int *)(&UNK_0015dfc8 + lVar9) == 0;
          bVar19 = *(int *)(&UNK_0015dfc8 + lVar11) == 0;
          bVar2 = !bVar18;
          if (bVar19) {
            bVar2 = bVar18;
          }
          bVar12 = bVar18 && !bVar19;
          bVar19 = !bVar18 && bVar19;
          goto LAB_001443a7;
        }
      }
    }
LAB_00144369:
    bVar12 = false;
    bVar2 = true;
  }
LAB_001443a4:
  bVar19 = bVar2;
  bVar2 = false;
LAB_001443a7:
  if (bVar12) {
    pMVar7 = *right;
    pMVar5 = (MOJOSHADER_astExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar5 == (MOJOSHADER_astExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar5 = (MOJOSHADER_astExpression *)0x0;
    }
    else {
      (pMVar5->ast).type = MOJOSHADER_AST_OP_CAST;
      (pMVar5->ast).filename = ctx->sourcefile;
      (pMVar5->ast).line = ctx->sourceline;
      pMVar5->datatype = _ldatatype;
      *(MOJOSHADER_astExpression **)&pMVar5[1].ast = pMVar7;
    }
    *right = pMVar5;
    pMVar3 = _ldatatype;
  }
  else if (bVar19) {
    pMVar7 = *left;
    pMVar5 = (MOJOSHADER_astExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar5 == (MOJOSHADER_astExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar5 = (MOJOSHADER_astExpression *)0x0;
    }
    else {
      (pMVar5->ast).type = MOJOSHADER_AST_OP_CAST;
      (pMVar5->ast).filename = ctx->sourcefile;
      (pMVar5->ast).line = ctx->sourceline;
      pMVar5->datatype = _rdatatype;
      *(MOJOSHADER_astExpression **)&pMVar5[1].ast = pMVar7;
    }
    *left = pMVar5;
    pMVar3 = _rdatatype;
  }
  else {
    if (!bVar2) {
      __assert_fail("choice == CHOOSE_NEITHER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x8b6,
                    "const MOJOSHADER_astDataType *add_type_coercion(Context *, MOJOSHADER_astExpression **, const MOJOSHADER_astDataType *, MOJOSHADER_astExpression **, const MOJOSHADER_astDataType *)"
                   );
    }
    failf(ctx,"%s","incompatible data types");
    delete_expr(ctx,*right);
    puVar6 = (undefined4 *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (puVar6 == (undefined4 *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      puVar6 = (undefined4 *)0x0;
    }
    else {
      *puVar6 = 0x31;
      *(char **)(puVar6 + 2) = ctx->sourcefile;
      puVar6[4] = ctx->sourceline;
      *(MOJOSHADER_astDataType **)(puVar6 + 6) = &ctx->dt_int;
      puVar6[8] = 0;
    }
    pMVar7 = (MOJOSHADER_astExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar7 == (MOJOSHADER_astExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      pMVar7 = (MOJOSHADER_astExpression *)0x0;
    }
    else {
      (pMVar7->ast).type = MOJOSHADER_AST_OP_CAST;
      (pMVar7->ast).filename = ctx->sourcefile;
      (pMVar7->ast).line = ctx->sourceline;
      pMVar7->datatype = _ldatatype;
      *(undefined4 **)&pMVar7[1].ast = puVar6;
    }
    *right = pMVar7;
  }
  return pMVar3;
}

Assistant:

static const MOJOSHADER_astDataType *add_type_coercion(Context *ctx,
                                     MOJOSHADER_astExpression **left,
                                     const MOJOSHADER_astDataType *_ldatatype,
                                     MOJOSHADER_astExpression **right,
                                     const MOJOSHADER_astDataType *_rdatatype)
{
    // !!! FIXME: this whole function is probably naive at best.
    const MOJOSHADER_astDataType *ldatatype = reduce_datatype(ctx, _ldatatype);
    const MOJOSHADER_astDataType *rdatatype = reduce_datatype(ctx, _rdatatype);

    if (ldatatype == rdatatype)
        return ldatatype;   // they already match, so we're done.

    struct {
        const MOJOSHADER_astDataTypeType type;
        const int bits;
        const int is_unsigned;
        const int floating;
    } typeinf[] = {
        { MOJOSHADER_AST_DATATYPE_BOOL,    1, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_HALF,   16, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_INT,    32, 0, 0 },
        { MOJOSHADER_AST_DATATYPE_UINT,   32, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_FLOAT,  32, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_DOUBLE, 64, 0, 1 },
    };

    int lvector = 0;
    int lmatrix = 0;
    int l = STATICARRAYLEN(typeinf);
    if (ldatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = ldatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            lvector = 1;
            type = ldatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            lmatrix = 1;
            type = ldatatype->matrix.base->type;
        } // if

        for (l = 0; l < STATICARRAYLEN(typeinf); l++)
        {
            if (typeinf[l].type == type)
                break;
        } // for
    } // if

    int rvector = 0;
    int rmatrix = 0;
    int r = STATICARRAYLEN(typeinf);
    if (rdatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = rdatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            rvector = 1;
            type = rdatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            rmatrix = 1;
            type = rdatatype->matrix.base->type;
        } // if

        for (r = 0; r < STATICARRAYLEN(typeinf); r++)
        {
            if (typeinf[r].type == type)
                break;
        } // for
    } // if

    enum { CHOOSE_NEITHER, CHOOSE_LEFT, CHOOSE_RIGHT } choice = CHOOSE_NEITHER;
    if ((l < STATICARRAYLEN(typeinf)) && (r < STATICARRAYLEN(typeinf)))
    {
        if (left == NULL)
            choice = CHOOSE_LEFT;  // we need to force to the lvalue.
        else if (lmatrix && !rmatrix)
            choice = CHOOSE_LEFT;
        else if (!lmatrix && rmatrix)
            choice = CHOOSE_RIGHT;
        else if (lvector && !rvector)
            choice = CHOOSE_LEFT;
        else if (!lvector && rvector)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].bits > typeinf[r].bits)
            choice = CHOOSE_LEFT;
        else if (typeinf[l].bits < typeinf[r].bits)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].floating && !typeinf[r].floating)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].floating && typeinf[r].floating)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].is_unsigned && !typeinf[r].is_unsigned)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].is_unsigned && typeinf[r].is_unsigned)
            choice = CHOOSE_RIGHT;
    } // if

    if (choice == CHOOSE_LEFT)
    {
        *right = new_cast_expr(ctx, _ldatatype, *right);
        return _ldatatype;
    } // if
    else if (choice == CHOOSE_RIGHT)
    {
        *left = new_cast_expr(ctx, _rdatatype, *left);
        return _rdatatype;
    } // else if

    assert(choice == CHOOSE_NEITHER);
    fail(ctx, "incompatible data types");
    // Ditch original (*right), force a literal value that matches
    //  ldatatype, so further processing is normalized.
    // !!! FIXME: force (right) to match (left).
    delete_expr(ctx, *right);
    *right = new_cast_expr(ctx, _ldatatype, new_literal_int_expr(ctx, 0));
    return ldatatype;
}